

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O1

Aig_Man_t * Dar_ManBalance(Aig_Man_t *p,int fUpdateLevel)

{
  int iVar1;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Aig_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  Vec_Vec_t *vStore;
  void **ppvVar12;
  Aig_Obj_t *pAVar13;
  Aig_Obj_t *pAVar14;
  Tim_Man_t *pTVar15;
  void *pvVar16;
  Vec_Ptr_t *pVVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  float fVar23;
  
  iVar6 = Aig_ManVerifyTopoOrder(p);
  if (iVar6 == 0) {
    __assert_fail("Aig_ManVerifyTopoOrder(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darBalance.c"
                  ,0x230,"Aig_Man_t *Dar_ManBalance(Aig_Man_t *, int)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  p_00->Time2Quit = p->Time2Quit;
  pVVar3 = p->vFlopNums;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    iVar6 = pVVar3->nSize;
    lVar21 = (long)iVar6;
    pVVar10->nSize = iVar6;
    pVVar10->nCap = iVar6;
    if (lVar21 == 0) {
      piVar11 = (int *)0x0;
    }
    else {
      piVar11 = (int *)malloc(lVar21 * 4);
    }
    pVVar10->pArray = piVar11;
    memcpy(piVar11,pVVar3->pArray,lVar21 << 2);
    p_00->vFlopNums = pVVar10;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  vStore = (Vec_Vec_t *)malloc(0x10);
  vStore->nCap = 0x32;
  vStore->nSize = 0;
  ppvVar12 = (void **)malloc(400);
  vStore->pArray = ppvVar12;
  if ((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) {
    pVVar17 = p->vCis;
    if (0 < pVVar17->nSize) {
      lVar21 = 0;
      do {
        pvVar16 = pVVar17->pArray[lVar21];
        pAVar13 = Aig_ObjCreateCi(p_00);
        *(ulong *)&pAVar13->field_0x18 =
             *(ulong *)&pAVar13->field_0x18 & 0xff000000ffffffff |
             *(ulong *)((long)pvVar16 + 0x18) & 0xffffff00000000;
        *(Aig_Obj_t **)((long)pvVar16 + 0x28) = pAVar13;
        lVar21 = lVar21 + 1;
        pVVar17 = p->vCis;
      } while (lVar21 < pVVar17->nSize);
    }
    if (p->nBarBufs == 0) {
      pVVar17 = p->vCos;
      if (0 < pVVar17->nSize) {
        lVar21 = 0;
        do {
          pAVar13 = Aig_ObjReal_rec(*(Aig_Obj_t **)((long)pVVar17->pArray[lVar21] + 8));
          pAVar14 = Dar_Balance_rec(p_00,(Aig_Obj_t *)((ulong)pAVar13 & 0xfffffffffffffffe),vStore,0
                                    ,fUpdateLevel);
          if (pAVar14 == (Aig_Obj_t *)0x0) {
            if (0 < vStore->nSize) {
              lVar21 = 0;
              do {
                pvVar16 = vStore->pArray[lVar21];
                if (pvVar16 != (void *)0x0) {
                  if (*(void **)((long)pvVar16 + 8) != (void *)0x0) {
                    free(*(void **)((long)pvVar16 + 8));
                    *(undefined8 *)((long)pvVar16 + 8) = 0;
                  }
                  free(pvVar16);
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < vStore->nSize);
            }
            if (vStore->pArray != (void **)0x0) {
              free(vStore->pArray);
              vStore->pArray = (void **)0x0;
            }
            free(vStore);
            Aig_ManStop(p_00);
            return (Aig_Man_t *)0x0;
          }
          Aig_ObjCreateCo(p_00,(Aig_Obj_t *)((ulong)((uint)pAVar13 & 1) ^ (ulong)pAVar14));
          lVar21 = lVar21 + 1;
          pVVar17 = p->vCos;
        } while (lVar21 < pVVar17->nSize);
      }
    }
    else {
      uVar7 = p->nObjs[3];
      uVar18 = 8;
      if (6 < uVar7 - 1) {
        uVar18 = uVar7;
      }
      if (uVar18 == 0) {
        pvVar16 = (void *)0x0;
      }
      else {
        pvVar16 = malloc((long)(int)uVar18 << 3);
      }
      iVar20 = 0;
      memset(pvVar16,0,(long)(int)uVar7 * 8);
      pVVar17 = p->vCos;
      iVar6 = pVVar17->nSize;
      bVar5 = 0 < iVar6;
      if (0 < iVar6) {
        do {
          iVar1 = p->nBarBufs;
          uVar18 = iVar20 - iVar1;
          if (iVar20 < iVar1) {
            uVar18 = (iVar20 - iVar1) + p->nObjs[3];
          }
          if (((int)uVar18 < 0) || (iVar6 <= (int)uVar18)) goto LAB_004ebafb;
          pAVar13 = Aig_ObjReal_rec(*(Aig_Obj_t **)((long)pVVar17->pArray[uVar18] + 8));
          pAVar14 = Dar_Balance_rec(p_00,(Aig_Obj_t *)((ulong)pAVar13 & 0xfffffffffffffffe),vStore,0
                                    ,fUpdateLevel);
          if (pAVar14 == (Aig_Obj_t *)0x0) {
            if (0 < vStore->nSize) {
              lVar21 = 0;
              do {
                pvVar4 = vStore->pArray[lVar21];
                if (pvVar4 != (void *)0x0) {
                  if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
                    free(*(void **)((long)pvVar4 + 8));
                    *(undefined8 *)((long)pvVar4 + 8) = 0;
                  }
                  free(pvVar4);
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < vStore->nSize);
            }
            if (vStore->pArray != (void **)0x0) {
              free(vStore->pArray);
              vStore->pArray = (void **)0x0;
            }
            free(vStore);
            Aig_ManStop(p_00);
          }
          else {
            if ((int)uVar7 <= (int)uVar18) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            *(ulong *)((long)pvVar16 + (ulong)uVar18 * 8) =
                 (ulong)((uint)pAVar13 & 1) ^ (ulong)pAVar14;
            if (iVar20 < p->nBarBufs) {
              uVar18 = (p->nObjs[2] - p->nBarBufs) + iVar20;
              if (((int)uVar18 < 0) || (p_00->vCis->nSize <= (int)uVar18)) goto LAB_004ebafb;
              pvVar4 = p_00->vCis->pArray[uVar18];
              *(ulong *)((long)pvVar4 + 0x18) =
                   *(ulong *)((long)pvVar4 + 0x18) & 0xff000000ffffffff |
                   *(ulong *)(((ulong)pAVar14 & 0xfffffffffffffffe) + 0x18) & 0xffffff00000000;
            }
          }
          if (pAVar14 == (Aig_Obj_t *)0x0) goto LAB_004eb9ce;
          iVar20 = iVar20 + 1;
          pVVar17 = p->vCos;
          iVar6 = pVVar17->nSize;
          bVar5 = iVar20 < iVar6;
        } while (iVar20 < iVar6);
      }
      if (0 < p->vCos->nSize) {
        uVar19 = 0;
        uVar22 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar22 = uVar19;
        }
        do {
          if (uVar22 == uVar19) {
LAB_004ebafb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)((long)pvVar16 + uVar19 * 8));
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)p->vCos->nSize);
      }
      if (pvVar16 != (void *)0x0) {
        free(pvVar16);
      }
LAB_004eb9ce:
      if (bVar5) {
        return (Aig_Man_t *)0x0;
      }
    }
  }
  else {
    Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    Aig_ManSetCioIds(p);
    pVVar17 = p->vObjs;
    bVar5 = 0 < pVVar17->nSize;
    if (0 < pVVar17->nSize) {
      lVar21 = 0;
      do {
        piVar11 = (int *)pVVar17->pArray[lVar21];
        if ((piVar11 != (int *)0x0) && (((uint)*(undefined8 *)(piVar11 + 6) & 7) - 7 < 0xfffffffe))
        {
          if (((ulong)piVar11 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
          }
          uVar7 = (uint)*(undefined8 *)(piVar11 + 6) & 7;
          if (uVar7 != 1) {
            if (uVar7 == 3) {
              pAVar13 = Aig_ObjReal_rec(*(Aig_Obj_t **)(piVar11 + 2));
              pAVar14 = Dar_Balance_rec(p_00,(Aig_Obj_t *)((ulong)pAVar13 & 0xfffffffffffffffe),
                                        vStore,0,fUpdateLevel);
              if (pAVar14 == (Aig_Obj_t *)0x0) {
                Vec_VecFree(vStore);
                Aig_ManStop(p_00);
                goto LAB_004eb6c7;
              }
              if (0xfffffffd < (piVar11[6] & 7U) - 7) goto LAB_004ebb39;
              Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,*piVar11,
                                  (float)(*(uint *)(((ulong)pAVar14 & 0xfffffffffffffffe) + 0x1c) &
                                         0xffffff));
              Aig_ObjCreateCo(p_00,(Aig_Obj_t *)((ulong)((uint)pAVar13 & 1) ^ (ulong)pAVar14));
            }
            else {
              if (uVar7 != 2) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darBalance.c"
                              ,0x264,"Aig_Man_t *Dar_ManBalance(Aig_Man_t *, int)");
              }
              pAVar13 = Aig_ObjCreateCi(p_00);
              *(Aig_Obj_t **)(piVar11 + 10) = pAVar13;
              if (0xfffffffd < (piVar11[6] & 7U) - 7) {
LAB_004ebb39:
                __assert_fail("!Aig_ObjIsNode(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
              }
              fVar23 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,*piVar11);
              *(ulong *)&pAVar13->field_0x18 =
                   *(ulong *)&pAVar13->field_0x18 & 0xff000000ffffffff |
                   (ulong)((int)fVar23 & 0xffffff) << 0x20;
            }
          }
        }
        lVar21 = lVar21 + 1;
        pVVar17 = p->vObjs;
        bVar5 = lVar21 < pVVar17->nSize;
      } while (lVar21 < pVVar17->nSize);
    }
    Aig_ManCleanCioIds(p);
    pTVar15 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar15;
LAB_004eb6c7:
    if (bVar5) {
      return (Aig_Man_t *)0x0;
    }
  }
  if (0 < vStore->nSize) {
    lVar21 = 0;
    do {
      pvVar16 = vStore->pArray[lVar21];
      if (pvVar16 != (void *)0x0) {
        if (*(void **)((long)pvVar16 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar16 + 8));
          *(undefined8 *)((long)pvVar16 + 8) = 0;
        }
        free(pvVar16);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < vStore->nSize);
  }
  if (vStore->pArray != (void **)0x0) {
    free(vStore->pArray);
    vStore->pArray = (void **)0x0;
  }
  free(vStore);
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar6 = Aig_ManCheck(p_00);
  if (iVar6 == 0) {
    puts("Dar_ManBalance(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Dar_ManBalance( Aig_Man_t * p, int fUpdateLevel )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pDriver, * pObjNew;
    Vec_Vec_t * vStore;
    int i;
    assert( Aig_ManVerifyTopoOrder(p) );
    // create the new manager 
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    pNew->Time2Quit = p->Time2Quit;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the PI nodes
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    vStore = Vec_VecAlloc( 50 );
    if ( p->pManTime != NULL )
    {
        float arrTime;
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
        Aig_ManSetCioIds( p );
        Aig_ManForEachObj( p, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) || Aig_ObjIsConst1(pObj) )
                continue;
            if ( Aig_ObjIsCi(pObj) )
            {
                // copy the PI
                pObjNew = Aig_ObjCreateCi(pNew); 
                pObj->pData = pObjNew;
                // set the arrival time of the new PI
                arrTime = Tim_ManGetCiArrival( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj) );
                pObjNew->Level = (int)arrTime;
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                // perform balancing
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                // save arrival time of the output
                arrTime = (float)Aig_Regular(pObjNew)->Level;
                Tim_ManSetCoArrival( (Tim_Man_t *)p->pManTime, Aig_ObjCioId(pObj), arrTime );
                // create PO
                pObjNew = Aig_ObjCreateCo( pNew, pObjNew );
            }
            else
                assert( 0 );
        }
        Aig_ManCleanCioIds( p );
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    }
    else
    {
        Aig_ManForEachCi( p, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(pNew); 
            pObjNew->Level = pObj->Level;
            pObj->pData = pObjNew;
        }
        if ( p->nBarBufs == 0 )
        {
            Aig_ManForEachCo( p, pObj, i )
            {
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                pObjNew = Aig_ObjCreateCo( pNew, pObjNew );
            }
        }
        else
        {
            Vec_Ptr_t * vLits = Vec_PtrStart( Aig_ManCoNum(p) );
            Aig_ManForEachCo( p, pObj, i )
            {
                int k = i < p->nBarBufs ? Aig_ManCoNum(p) - p->nBarBufs + i : i - p->nBarBufs;
                pObj = Aig_ManCo( p, k );
                pDriver = Aig_ObjReal_rec( Aig_ObjChild0(pObj) );
                pObjNew = Dar_Balance_rec( pNew, Aig_Regular(pDriver), vStore, 0, fUpdateLevel );
                if ( pObjNew == NULL )
                {
                    Vec_VecFree( vStore );
                    Aig_ManStop( pNew );
                    return NULL;
                }
                pObjNew = Aig_NotCond( pObjNew, Aig_IsComplement(pDriver) );
                Vec_PtrWriteEntry( vLits, k, pObjNew );
                if ( i < p->nBarBufs )
                    Aig_ManCi(pNew, Aig_ManCiNum(p) - p->nBarBufs + i)->Level = Aig_Regular(pObjNew)->Level;
            }
            Aig_ManForEachCo( p, pObj, i )
                Aig_ObjCreateCo( pNew, (Aig_Obj_t *)Vec_PtrEntry(vLits, i) );
            Vec_PtrFree(vLits);
        }
    }
    Vec_VecFree( vStore );
    // remove dangling nodes
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting AIG
    if ( !Aig_ManCheck(pNew) )
        printf( "Dar_ManBalance(): The check has failed.\n" );
    return pNew;
}